

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.h
# Opt level: O2

int __thiscall
soplex::SPxEquiliSC<double>::clone
          (SPxEquiliSC<double> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SPxEquiliSC<double> *this_00;
  
  this_00 = (SPxEquiliSC<double> *)operator_new(0x40);
  SPxEquiliSC(this_00,this);
  return (int)this_00;
}

Assistant:

inline virtual SPxScaler<R>* clone() const override
   {
      return new SPxEquiliSC<R>(*this);
   }